

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QNumber.hpp
# Opt level: O0

void __thiscall Qentem::QNumber64::QNumber64<unsigned_int>(QNumber64 *this,uint num)

{
  uint num_local;
  QNumber64 *this_local;
  
  *(undefined8 *)this = 0;
  *(ulong *)this = (ulong)num;
  return;
}

Assistant:

inline explicit QNumber64(const Number_T num) noexcept {
        if QENTEM_CONST_EXPRESSION (IsFloat<Number_T>()) {
            Real = double(num);
        } else if QENTEM_CONST_EXPRESSION (IsUnsigned<Number_T>()) {
            Natural = SizeT64(num);
        } else {
            Integer = SizeT64I(num);
        }